

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

int UnicodeToUTF8(LPCWSTR lpSrcStr,int cchSrc,LPSTR lpDestStr,int cchDest)

{
  WCHAR WVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  iVar3 = 0;
  uVar8 = 0;
  do {
    uVar6 = (ushort)uVar8;
    if (cchSrc == 0) {
      cchSrc = -1;
LAB_00329890:
      if (((cchDest != 0) && (cchSrc < 0)) && (uVar6 != 0)) {
        if (iVar3 + 2 < cchDest) {
          lpDestStr[iVar3] = (byte)(uVar6 >> 0xc) | 0xe0;
          lpDestStr[iVar3 + 1] = (byte)(uVar6 >> 6) & 0x3f | 0x80;
          lpDestStr[iVar3 + 2] = (byte)uVar6 & 0x3f | 0x80;
          return iVar3 + 3;
        }
        cchSrc = cchSrc + 1;
      }
      if ((cchDest != 0) && (-1 < cchSrc)) {
        SetLastError(0x7a);
        iVar3 = 0;
      }
      return iVar3;
    }
    if ((cchDest != 0) && (cchDest <= iVar3)) {
      cchSrc = cchSrc + -1;
      goto LAB_00329890;
    }
    WVar1 = *lpSrcStr;
    uVar5 = (ulong)(ushort)WVar1;
    uVar7 = (uint)(ushort)WVar1;
    uVar9 = (uint)uVar8;
    if ((WVar1 & 0xfc00U) == 0xd800) {
      if (cchDest == 0) {
        iVar3 = iVar3 + 3;
      }
      else {
        uVar7 = (uint)(ushort)WVar1;
        if (uVar6 != 0) {
          iVar4 = iVar3 + 2;
          if (cchDest <= iVar4) goto LAB_00329890;
          lpDestStr[iVar3] = (byte)(uVar8 >> 0xc) | 0xe0;
          lpDestStr[iVar3 + 1] = (byte)(uVar9 >> 6) & 0x3f | 0x80;
          iVar3 = iVar3 + 3;
          lpDestStr[iVar4] = (byte)uVar8 & 0x3f | 0x80;
          uVar7 = (uint)(ushort)*lpSrcStr;
        }
      }
    }
    else {
      if (uVar6 == 0) {
        if ((ushort)WVar1 < 0x80) {
          if (cchDest != 0) {
LAB_003297a9:
            if (cchDest <= iVar3) goto LAB_003298ff;
            lpDestStr[iVar3] = (CHAR)uVar5;
          }
LAB_003297d7:
          iVar3 = iVar3 + 1;
        }
        else {
          if ((ushort)WVar1 < 0x800) {
            if (cchDest == 0) goto LAB_00329870;
            goto LAB_003297e6;
          }
          if (cchDest == 0) {
LAB_00329875:
            iVar3 = iVar3 + 3;
            goto LAB_00329878;
          }
LAB_00329816:
          iVar4 = iVar3 + 2;
          if (cchDest <= iVar4) goto LAB_003298ff;
          lpDestStr[iVar3] = (byte)(uVar5 >> 0xc) | 0xe0;
          lpDestStr[iVar3 + 1] = (byte)((ushort)*lpSrcStr >> 6) & 0x3f | 0x80;
          bVar2 = (byte)*lpSrcStr;
          iVar3 = iVar3 + 3;
LAB_0032985f:
          lpDestStr[iVar4] = bVar2 & 0x3f | 0x80;
        }
      }
      else if ((WVar1 & 0xfc00U) == 0xdc00) {
        if (cchDest == 0) goto LAB_003297d7;
        iVar4 = iVar3 + 3;
        if (cchDest <= iVar4) goto LAB_00329890;
        uVar7 = (uint)(ushort)WVar1 + uVar9 * 0x400 + 0xfca02400;
        lpDestStr[iVar3] = (byte)(uVar7 >> 0x12) | 0xf0;
        lpDestStr[iVar3 + 1] = (byte)(uVar7 >> 0xc) & 0x3f | 0x80;
        lpDestStr[iVar3 + 2] = (byte)(uVar7 >> 6) & 0x3f | 0x80;
        iVar3 = iVar3 + 4;
        lpDestStr[iVar4] = (byte)WVar1 & 0x3f | 0x80;
      }
      else {
        if (cchDest != 0) {
          iVar4 = iVar3 + 2;
          if (iVar4 < cchDest) {
            lpDestStr[iVar3] = (byte)(uVar8 >> 0xc) | 0xe0;
            lpDestStr[iVar3 + 1] = (byte)(uVar9 >> 6) & 0x3f | 0x80;
            iVar3 = iVar3 + 3;
            lpDestStr[iVar4] = (byte)uVar8 & 0x3f | 0x80;
            WVar1 = *lpSrcStr;
            uVar5 = (ulong)(ushort)WVar1;
            uVar7 = (uint)(ushort)WVar1;
            if ((ushort)WVar1 < 0x80) goto LAB_003297a9;
            if (0x7ff < (ushort)WVar1) goto LAB_00329816;
LAB_003297e6:
            iVar4 = iVar3 + 1;
            if (iVar4 < cchDest) {
              lpDestStr[iVar3] = (byte)(uVar7 >> 6) | 0xc0;
              bVar2 = (byte)*lpSrcStr;
              iVar3 = iVar3 + 2;
              goto LAB_0032985f;
            }
LAB_003298ff:
            uVar6 = 0;
          }
          goto LAB_00329890;
        }
        if ((ushort)WVar1 < 0x80) goto LAB_003297d7;
        if (0x7ff < (ushort)WVar1) goto LAB_00329875;
LAB_00329870:
        iVar3 = iVar3 + 2;
      }
LAB_00329878:
      uVar7 = 0;
    }
    lpSrcStr = lpSrcStr + 1;
    cchSrc = cchSrc + -1;
    uVar8 = (ulong)uVar7;
  } while( true );
}

Assistant:

int UnicodeToUTF8(
    LPCWSTR lpSrcStr,
    int cchSrc,
    LPSTR lpDestStr,
    int cchDest)
{
    LPCWSTR lpWC = lpSrcStr;
    int     cchU8 = 0;                // # of UTF8 chars generated
    DWORD   dwSurrogateChar;
    WCHAR   wchHighSurrogate = 0;
    BOOL    bHandled;


    while ((cchSrc--) && ((cchDest == 0) || (cchU8 < cchDest)))
    {
        bHandled = FALSE;

        //
        // Check if high surrogate is available
        //
        if ((*lpWC >= HIGH_SURROGATE_START) && (*lpWC <= HIGH_SURROGATE_END))
        {
            if (cchDest)
            {
                // Another high surrogate, then treat the 1st as normal
                // Unicode character.
                if (wchHighSurrogate)
                {
                    if ((cchU8 + 2) < cchDest)
                    {
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
                    }
                    else
                    {
                        // not enough buffer
                        cchSrc++;
                        break;
                    }
                }
            }
            else
            {
                cchU8 += 3;
            }
            wchHighSurrogate = *lpWC;
            bHandled = TRUE;
        }

        if (!bHandled && wchHighSurrogate)
        {
            if ((*lpWC >= LOW_SURROGATE_START) && (*lpWC <= LOW_SURROGATE_END))
            {
                 // wheee, valid surrogate pairs

                 if (cchDest)
                 {
                     if ((cchU8 + 3) < cchDest)
                     {
                         dwSurrogateChar = (((wchHighSurrogate-0xD800) << 10) + (*lpWC - 0xDC00) + 0x10000);

                         lpDestStr[cchU8++] = (UTF8_1ST_OF_4 |
                                               (unsigned char)(dwSurrogateChar >> 18));           // 3 bits from 1st byte

                         lpDestStr[cchU8++] =  (UTF8_TRAIL |
                                                (unsigned char)((dwSurrogateChar >> 12) & 0x3f)); // 6 bits from 2nd byte

                         lpDestStr[cchU8++] = (UTF8_TRAIL |
                                               (unsigned char)((dwSurrogateChar >> 6) & 0x3f));   // 6 bits from 3rd byte

                         lpDestStr[cchU8++] = (UTF8_TRAIL |
                                               (unsigned char)(0x3f & dwSurrogateChar));          // 6 bits from 4th byte
                     }
                     else
                     {
                        // not enough buffer
                        cchSrc++;
                        break;
                     }
                 }
                 else
                 {
                     // we already counted 3 previously (in high surrogate)
                     cchU8 ++;
                 }

                 bHandled = TRUE;
            }
            else
            {
                 // Bad Surrogate pair : ERROR
                 // Just process wchHighSurrogate , and the code below will
                 // process the current code point
                 if (cchDest)
                 {
                     if ((cchU8 + 2) < cchDest)
                     {
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
                     }
                     else
                     {
                        // not enough buffer
                        cchSrc++;
                        break;
                     }
                 }
            }

            wchHighSurrogate = 0;
        }

        if (!bHandled)
        {
            if (*lpWC <= ASCII)
            {
                //
                //  Found ASCII.
                //
                if (cchDest)
                {
                    if (cchU8 < cchDest) 
                    {
                        lpDestStr[cchU8] = (char)*lpWC;
                    } 
                    else 
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                cchU8++;
            }
            else if (*lpWC <= UTF8_2_MAX)
            {
                //
                //  Found 2 byte sequence if < 0x07ff (11 bits).
                //
                if (cchDest)
                {
                    if ((cchU8 + 1) < cchDest)
                    {
                        //
                        //  Use upper 5 bits in first byte.
                        //  Use lower 6 bits in second byte.
                        //
                        lpDestStr[cchU8++] = UTF8_1ST_OF_2 | (*lpWC >> 6);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(*lpWC);
                    }
                    else
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                else
                {
                    cchU8 += 2;
                }
            }
            else
            {
                //
                //  Found 3 byte sequence.
                //
                if (cchDest)
                {
                    if ((cchU8 + 2) < cchDest)
                    {
                        //
                        //  Use upper  4 bits in first byte.
                        //  Use middle 6 bits in second byte.
                        //  Use lower  6 bits in third byte.
                        //
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(*lpWC);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(*lpWC);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(*lpWC);
                    }
                    else
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                else
                {
                    cchU8 += 3;
                }
            }
        }

        lpWC++;
    }

    //
    // If the last character was a high surrogate, then handle it as a normal
    // unicode character.
    //
    if ((cchSrc < 0) && (wchHighSurrogate != 0))
    {
        if (cchDest)
        {
            if ((cchU8 + 2) < cchDest)
            {
                lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
            }
            else
            {
                cchSrc++;
            }
        }
    }

    //
    //  Make sure the destination buffer was large enough.
    //
    if (cchDest && (cchSrc >= 0))
    {
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        return (0);
    }

    //
    //  Return the number of UTF-8 characters written.
    //
    return (cchU8);
}